

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int items_count,float items_height)

{
  ImGuiWindow *pIVar1;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined4 in_XMM0_Da;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTable *in_stack_000000d0;
  
  pIVar1 = GImGui->CurrentWindow;
  if ((GImGui->CurrentTable != (ImGuiTable *)0x0) && ((GImGui->CurrentTable->IsInsideRow & 1U) != 0)
     ) {
    ImGui::TableEndRow(in_stack_000000d0);
  }
  in_RDI[6] = (pIVar1->DC).CursorPos.y;
  in_RDI[5] = in_XMM0_Da;
  in_RDI[2] = in_ESI;
  in_RDI[4] = 0;
  in_RDI[3] = 0;
  *in_RDI = 0xffffffff;
  in_RDI[1] = 0;
  return;
}

Assistant:

void ImGuiListClipper::Begin(int items_count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (ImGuiTable* table = g.CurrentTable)
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = items_count;
    ItemsFrozen = 0;
    StepNo = 0;
    DisplayStart = -1;
    DisplayEnd = 0;
}